

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CheckerInstanceStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CheckerInstanceStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::CheckerInstantiationSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,
          CheckerInstantiationSyntax *args_2)

{
  CheckerInstanceStatementSyntax *this_00;
  
  this_00 = (CheckerInstanceStatementSyntax *)allocate(this,0x60,8);
  syntax::CheckerInstanceStatementSyntax::CheckerInstanceStatementSyntax
            (this_00,*args,args_1,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }